

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall kj::_::ForkHubBase::fire(ForkHubBase *this)

{
  ForkBranchBase *this_00;
  Event *extraout_RDX;
  Event *pEVar1;
  Event *extraout_RDX_00;
  long in_RSI;
  ForkBranchBase **ppFVar2;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar3;
  NullableValue<kj::Exception> _exception2570;
  NullableValue<kj::Exception> local_4d8;
  NullableValue<kj::Exception> local_340;
  
  (**(code **)(**(long **)(in_RSI + 0x58) + 0x18))
            (*(long **)(in_RSI + 0x58),*(undefined8 *)(in_RSI + 0x60));
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(in_RSI + 0x58));
  local_4d8.isSet = false;
  NullableValue<kj::Exception>::NullableValue(&local_340,&local_4d8);
  NullableValue<kj::Exception>::~NullableValue(&local_4d8);
  if (local_340.isSet == true) {
    ExceptionOrValue::addException(*(ExceptionOrValue **)(in_RSI + 0x60),&local_340.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_340);
  ppFVar2 = (ForkBranchBase **)(in_RSI + 0x68);
  pEVar1 = extraout_RDX;
  while (this_00 = *ppFVar2, this_00 != (ForkBranchBase *)0x0) {
    ForkBranchBase::hubReady(this_00);
    *this_00->prevPtr = (ForkBranchBase *)0x0;
    this_00->prevPtr = (ForkBranchBase **)0x0;
    pEVar1 = extraout_RDX_00;
    ppFVar2 = &this_00->next;
  }
  **(undefined8 **)(in_RSI + 0x70) = 0;
  *(undefined8 *)(in_RSI + 0x70) = 0;
  (this->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)0x0;
  (this->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
  MVar3.ptr.ptr = pEVar1;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<Event>> ForkHubBase::fire() {
  // Dependency is ready.  Fetch its result and then delete the node.
  inner->get(resultRef);
  KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
    inner = nullptr;
  })) {
    resultRef.addException(kj::mv(exception));
  }

  for (auto branch = headBranch; branch != nullptr; branch = branch->next) {
    branch->hubReady();
    *branch->prevPtr = nullptr;
    branch->prevPtr = nullptr;
  }
  *tailBranch = nullptr;

  // Indicate that the list is no longer active.
  tailBranch = nullptr;

  return kj::none;
}